

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<PClass_*,_bool,_THashTraits<PClass_*>,_TValueTraits<bool>_>::Resize
          (TMap<PClass_*,_bool,_THashTraits<PClass_*>,_TValueTraits<bool>_> *this,hash_t nhsize)

{
  uint uVar1;
  Node *block;
  bool bVar2;
  Node *pNVar3;
  Node *n;
  Node *nold;
  uint local_18;
  hash_t oldhsize;
  hash_t i;
  hash_t nhsize_local;
  TMap<PClass_*,_bool,_THashTraits<PClass_*>,_TValueTraits<bool>_> *this_local;
  
  uVar1 = this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    bVar2 = Node::IsNil(block + local_18);
    if (!bVar2) {
      pNVar3 = NewKey(this,block[local_18].Pair.Key);
      (pNVar3->Pair).Value = (bool)(block[local_18].Pair.Value & 1);
    }
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}